

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O2

void __thiscall
ArcflowSol::ArcflowSol
          (ArcflowSol *this,Instance *_inst,
          map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *_flow,int _S,
          vector<int,_std::allocator<int>_> *_Ts,int _LOSS)

{
  int *piVar1;
  uint uVar2;
  pointer piVar3;
  pointer pvVar4;
  pointer ppVar5;
  pointer piVar6;
  bool bVar7;
  pattern_pair *pat;
  pointer ppVar8;
  ulong uVar9;
  _Rb_tree_node_base *p_Var10;
  runtime_error *prVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *__range1;
  vector<int,_std::allocator<int>_> dem;
  char _error_msg_ [256];
  
  Instance::Instance(&this->inst,_inst);
  std::
  _Rb_tree<Arc,_std::pair<const_Arc,_int>,_std::_Select1st<std::pair<const_Arc,_int>_>,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>
  ::_Rb_tree(&(this->flow)._M_t,&_flow->_M_t);
  this->S = _S;
  this_01 = &this->Ts;
  std::vector<int,_std::allocator<int>_>::vector(this_01,_Ts);
  this->LOSS = _LOSS;
  this_00 = &this->nbins;
  (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sols).
  super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sols).
  super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sols).
  super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&dem,(long)(this->inst).m,(allocator_type *)_error_msg_);
  piVar3 = (this->inst).demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar12 = 0; lVar12 < (this->inst).m; lVar12 = lVar12 + 1) {
    dem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar12] = piVar3[lVar12];
  }
  this->objvalue = 0;
  std::
  vector<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ::resize(&this->sols,(long)(this->inst).nbtypes);
  std::vector<int,_std::allocator<int>_>::resize(this_00,(long)(this->inst).nbtypes);
  for (lVar12 = 0; lVar12 < (this->inst).nbtypes; lVar12 = lVar12 + 1) {
    extract_solution((vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      *)_error_msg_,this,&dem,
                     (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar12]);
    std::
    vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ::_M_move_assign((this->sols).
                     super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar12,
                     (vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      *)_error_msg_);
    std::
    vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ::~vector((vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               *)_error_msg_);
    bVar7 = is_valid(this,(this->sols).
                          super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar12,(int)lVar12);
    if (!bVar7) {
      snprintf(_error_msg_,0x100,"Error: `%s` in \"%s\" line %d","Invalid solution! (capacity)",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
               ,0x1d);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,_error_msg_);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar4 = (this->sols).
             super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = *(pointer *)
              ((long)&pvVar4[lVar12].
                      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    piVar3 = (this->inst).Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (ppVar8 = pvVar4[lVar12].
                  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar5; ppVar8 = ppVar8 + 1)
    {
      iVar14 = ppVar8->first;
      this->objvalue = this->objvalue + piVar3[lVar12] * iVar14;
      piVar1 = piVar6 + lVar12;
      *piVar1 = *piVar1 + iVar14;
    }
  }
  uVar2 = (this->inst).m;
  uVar13 = 0;
  uVar9 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar9 = uVar13;
  }
  while (uVar9 != uVar13) {
    piVar1 = dem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + uVar13;
    uVar13 = uVar13 + 1;
    if (0 < *piVar1) {
      snprintf(_error_msg_,0x100,"Error: `%s` in \"%s\" line %d","Invalid solution! (demand)",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
               ,0x28,this_00,this_01);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,_error_msg_);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  iVar14 = 0;
  for (p_Var10 = (this->flow)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &(this->flow)._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    iVar14 = iVar14 + *(int *)((long)&p_Var10[1]._M_parent + 4);
  }
  if (iVar14 == 0) {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&dem.super__Vector_base<int,_std::allocator<int>_>);
    return;
  }
  snprintf(_error_msg_,0x100,"Error: `%s` in \"%s\" line %d","Invalid solution! (flow)",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
           ,0x31,this_00,this_01);
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar11,_error_msg_);
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ArcflowSol::ArcflowSol(const Instance &_inst, const std::map<Arc, int> &_flow,
					   int _S, const std::vector<int> &_Ts, int _LOSS) :
		inst(_inst), flow(_flow), S(_S), Ts(_Ts), LOSS(_LOSS) {
	std::vector<int> dem(inst.m);
	for (int i = 0; i < inst.m; i++) {
		dem[i] = inst.demands[i];
	}

	objvalue = 0;
	sols.resize(inst.nbtypes);
	nbins.resize(inst.nbtypes);
	for (int t = 0; t < inst.nbtypes; t++) {
		sols[t] = extract_solution(&dem, Ts[t]);
		if (!is_valid(sols[t], t)) {
			throw_error("Invalid solution! (capacity)");
		}

		for (const pattern_pair &pat : sols[t]) {
			objvalue += pat.first * inst.Cs[t];
			nbins[t] += pat.first;
		}
	}

	for (int i = 0; i < inst.m; i++) {
		if (dem[i] > 0) {
			throw_error("Invalid solution! (demand)");
		}
	}

	int fs = 0;
	for (const auto &kvpair : flow) {
		fs += kvpair.second;
	}
	if (fs != 0) {
		throw_error("Invalid solution! (flow)");
	}
}